

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gain_calculator_objects.cpp
# Opt level: O0

void __thiscall
ear::throw_if_not_implemented::operator()
          (throw_if_not_implemented *this,PolarObjectDivergence *divergence)

{
  not_implemented *this_00;
  allocator<char> local_39;
  string local_38;
  PolarObjectDivergence *local_18;
  PolarObjectDivergence *divergence_local;
  throw_if_not_implemented *this_local;
  
  if ((*(double *)divergence == 0.0) && (!NAN(*(double *)divergence))) {
    return;
  }
  local_18 = divergence;
  divergence_local = (PolarObjectDivergence *)this;
  this_00 = (not_implemented *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"divergence",&local_39);
  not_implemented::not_implemented(this_00,&local_38);
  __cxa_throw(this_00,&not_implemented::typeinfo,not_implemented::~not_implemented);
}

Assistant:

void operator()(const PolarObjectDivergence& divergence) const {
      if (divergence.divergence != 0.0) throw not_implemented("divergence");
    }